

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O0

Vec3fa embree::MatteMaterial__sample
                 (ISPCMatteMaterial *This,BRDF *brdf,Vec3fa *Lw,Vec3fa *wo,DifferentialGeometry *dg,
                 Sample3f *wi_o,Medium *medium,Vec2f *s)

{
  Vec3fa *in_RCX;
  Lambertian *in_RDX;
  long in_RSI;
  DifferentialGeometry *in_R8;
  Sample3f *in_R9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  Lambertian lambertian;
  Vec2f *in_stack_ffffffffffffffb8;
  
  make_Lambertian(*(Vec3fa **)(in_RSI + 0x10));
  aVar1 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
          Lambertian__sample(in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffb8);
  return (Vec3fa)aVar1;
}

Assistant:

Vec3fa MatteMaterial__sample(ISPCMatteMaterial* This, const BRDF& brdf, const Vec3fa& Lw, const Vec3fa& wo, const DifferentialGeometry& dg, Sample3f& wi_o, Medium& medium, const Vec2f& s)
{
  Lambertian lambertian = make_Lambertian(Vec3fa((Vec3fa)This->reflectance));
  return Lambertian__sample(&lambertian,wo,dg,wi_o,s);
}